

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::RgbaOutputFile::writePixels(RgbaOutputFile *this,int numScanLines)

{
  Lock local_20;
  
  local_20._mutex = &this->_toYca->super_Mutex;
  if ((ToYca *)local_20._mutex != (ToYca *)0x0) {
    std::mutex::lock(local_20._mutex);
    local_20._locked = true;
    ToYca::writePixels(this->_toYca,numScanLines);
    IlmThread_2_5::Lock::~Lock(&local_20);
    return;
  }
  OutputFile::writePixels(this->_outputFile,numScanLines);
  return;
}

Assistant:

void	
RgbaOutputFile::writePixels (int numScanLines)
{
    if (_toYca)
    {
	Lock lock (*_toYca);
	_toYca->writePixels (numScanLines);
    }
    else
    {
	_outputFile->writePixels (numScanLines);
    }
}